

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

void * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::consume_operation::unaligned_element_ptr(consume_operation *this)

{
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  ulong uVar2;
  
  uVar2 = (this->m_consume_data).m_next_ptr;
  if (uVar2 < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x3f5);
    uVar2 = (this->m_consume_data).m_next_ptr;
  }
  pCVar1 = (this->m_consume_data).m_control + 3;
  if ((uVar2 & 4) != 0) {
    pCVar1 = (ControlBlock *)pCVar1->m_next;
  }
  return pCVar1;
}

Assistant:

void * unaligned_element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_unaligned_element(
                  m_consume_data.m_control, m_consume_data.external());
            }